

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

bool Fossilize::find_layer
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *layers,char *layer)

{
  VkLayerProperties *pVVar1;
  bool bVar2;
  __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
  __it;
  long lVar3;
  __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
  _Var4;
  long lVar5;
  char **local_40;
  char *local_38;
  
  local_40 = &local_38;
  local_38 = "VK_LAYER_KHRONOS_validation";
  __it._M_current =
       (layers->super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pVVar1 = (layers->super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pVVar1 - (long)__it._M_current;
  for (lVar3 = lVar5 / 0x208 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                          *)&local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_001671da;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                          *)&local_40,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001671da;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                          *)&local_40,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001671da;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                          *)&local_40,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001671da;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x820;
  }
  lVar5 = lVar5 / 0x208;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = pVVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::$_0>
                  ::operator()((_Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                                *)&local_40,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_001671da;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                          *)&local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_001671da;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::$_0>
          ::operator()((_Iter_pred<Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                        *)&local_40,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = pVVar1;
  }
LAB_001671da:
  return _Var4._M_current != pVVar1;
}

Assistant:

static bool find_layer(const vector<VkLayerProperties> &layers, const char *layer)
{
	auto itr = find_if(begin(layers), end(layers), [&](const VkLayerProperties &prop) -> bool {
		return strcmp(layer, prop.layerName) == 0;
	});
	return itr != end(layers);
}